

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

int uv__iou_fs_read_or_write(uv_loop_t *loop,uv_fs_t *req,int is_read)

{
  uint8_t uVar1;
  uv__iou *iou_00;
  uv__io_uring_sqe *puVar2;
  uint64_t local_40;
  uv__iou *iou;
  uv__io_uring_sqe *sqe;
  int is_read_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  if (0x400 < req->nbufs) {
    if (is_read == 0) {
      return 0;
    }
    req->nbufs = 0x400;
  }
  iou_00 = (uv__iou *)((long)loop->internal_fields + 0x150);
  puVar2 = uv__iou_get_sqe(iou_00,loop,req);
  if (puVar2 == (uv__io_uring_sqe *)0x0) {
    loop_local._4_4_ = 0;
  }
  else {
    puVar2->field_5 = (anon_union_8_1_898948ef_for_uv__io_uring_sqe_6)req->bufs;
    puVar2->fd = req->file;
    puVar2->len = req->nbufs;
    if (req->off < 0) {
      local_40 = 0xffffffffffffffff;
    }
    else {
      local_40 = req->off;
    }
    (puVar2->field_4).off = local_40;
    uVar1 = '\x02';
    if (is_read != 0) {
      uVar1 = '\x01';
    }
    puVar2->opcode = uVar1;
    uv__iou_submit(iou_00);
    loop_local._4_4_ = 1;
  }
  return loop_local._4_4_;
}

Assistant:

int uv__iou_fs_read_or_write(uv_loop_t* loop,
                             uv_fs_t* req,
                             int is_read) {
  struct uv__io_uring_sqe* sqe;
  struct uv__iou* iou;

  /* If iovcnt is greater than IOV_MAX, cap it to IOV_MAX on reads and fallback
   * to the threadpool on writes */
  if (req->nbufs > IOV_MAX) {
    if (is_read)
      req->nbufs = IOV_MAX;
    else
      return 0;
  }

  iou = &uv__get_internal_fields(loop)->iou;

  sqe = uv__iou_get_sqe(iou, loop, req);
  if (sqe == NULL)
    return 0;

  sqe->addr = (uintptr_t) req->bufs;
  sqe->fd = req->file;
  sqe->len = req->nbufs;
  sqe->off = req->off < 0 ? -1 : req->off;
  sqe->opcode = is_read ? UV__IORING_OP_READV : UV__IORING_OP_WRITEV;

  uv__iou_submit(iou);

  return 1;
}